

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModelHandle.cpp
# Opt level: O3

bool __thiscall
Rml::DataModelConstructor::BindFunc
          (DataModelConstructor *this,String *name,DataGetFunc *get_func,DataSetFunc *set_func)

{
  DataModel *this_00;
  _Manager_type p_Var1;
  bool bVar2;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  this_00 = this->model;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = get_func->_M_invoker;
  p_Var1 = (get_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(get_func->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(get_func->super__Function_base)._M_functor + 8);
    (get_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    get_func->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = set_func->_M_invoker;
  p_Var1 = (set_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(set_func->super__Function_base)._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(set_func->super__Function_base)._M_functor + 8);
    (set_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    set_func->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var1;
  }
  bVar2 = DataModel::BindFunc(this_00,name,(DataGetFunc *)&local_28,(DataSetFunc *)&local_48);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return bVar2;
}

Assistant:

bool DataModelConstructor::BindFunc(const String& name, DataGetFunc get_func, DataSetFunc set_func)
{
	return model->BindFunc(name, std::move(get_func), std::move(set_func));
}